

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# precondition.cpp
# Opt level: O2

void __thiscall BoundaryElement::precondition_diagonal(BoundaryElement *this,double *z,double *r)

{
  double dVar1;
  Timers_BoundaryElement *pTVar2;
  size_t i_1;
  rep rVar3;
  ulong uVar4;
  size_t i;
  ulong uVar5;
  
  pTVar2 = this->timers_;
  rVar3 = std::chrono::_V2::steady_clock::now();
  (pTVar2->precondition).start_time_.__d.__r = rVar3;
  dVar1 = this->params_->phys_eps_;
  uVar4 = (this->elements_->super_Particles).num_;
  for (uVar5 = 0; uVar4 != uVar5; uVar5 = uVar5 + 1) {
    z[uVar5] = r[uVar5] / ((dVar1 + 1.0) * 0.5);
  }
  uVar5 = uVar4 * 2;
  for (; uVar4 < uVar5; uVar4 = uVar4 + 1) {
    z[uVar4] = r[uVar4] / ((1.0 / dVar1 + 1.0) * 0.5);
  }
  Timer::stop(&this->timers_->precondition);
  return;
}

Assistant:

void BoundaryElement::precondition_diagonal(double *z, double *r)
{
    timers_.precondition.start();

    double potential_coeff_1 = 0.5 * (1. +      params_.phys_eps_);
    double potential_coeff_2 = 0.5 * (1. + 1. / params_.phys_eps_);
    
    for (std::size_t i = 0;                i <     elements_.num(); ++i) z[i] = r[i] / potential_coeff_1;
    for (std::size_t i = elements_.num(); i < 2 * elements_.num(); ++i) z[i] = r[i] / potential_coeff_2;

    timers_.precondition.stop();
}